

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.cpp
# Opt level: O0

void pstore::index::flush_indices
               (transaction_base *transaction,index_records_array *locations,uint generation)

{
  type_conflict tVar1;
  size_type sVar2;
  uint local_20;
  type_conflict ctr;
  uint generation_local;
  index_records_array *locations_local;
  transaction_base *transaction_local;
  
  for (local_20 = 0; tVar1 = anon_unknown.dwarf_a9243::index_integral(last), local_20 <= tVar1;
      local_20 = local_20 + 1) {
    switch(local_20) {
    case 0:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)0>
                (transaction,locations,generation);
      break;
    case 1:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)1>
                (transaction,locations,generation);
      break;
    case 2:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)2>
                (transaction,locations,generation);
      break;
    case 3:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)3>
                (transaction,locations,generation);
      break;
    case 4:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)4>
                (transaction,locations,generation);
      break;
    case 5:
      anon_unknown.dwarf_a9243::flush_index<(pstore::trailer::indices)5>
                (transaction,locations,generation);
      break;
    case 6:
    }
  }
  sVar2 = std::array<pstore::typed_address<pstore::index::header_block>,_6UL>::size(locations);
  tVar1 = anon_unknown.dwarf_a9243::index_integral(last);
  if (sVar2 != tVar1) {
    assert_failed("locations->size () == index_integral (trailer::indices::last)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/index_types.cpp"
                  ,0x3d);
  }
  return;
}

Assistant:

void flush_indices (transaction_base & transaction,
                            trailer::index_records_array * const locations,
                            unsigned const generation) {
#define X(k)                                                                                       \
    case trailer::indices::k:                                                                      \
        flush_index<trailer::indices::k> (transaction, locations, generation);                     \
        break;

            for (auto ctr = std::underlying_type<trailer::indices>::type{0};
                 ctr <= index_integral (trailer::indices::last); ++ctr) {
                switch (static_cast<trailer::indices> (ctr)) {
                    PSTORE_INDICES
                case trailer::indices::last: break;
                }
            }
#undef X
            PSTORE_ASSERT (locations->size () == index_integral (trailer::indices::last));
        }